

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::BlindRawTransactionRequest::ConvertFromStruct
          (BlindRawTransactionRequest *this,BlindRawTransactionRequestStruct *data)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  pointer __x;
  
  std::__cxx11::string::_M_assign((string *)&this->tx_);
  core::JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
  ::ConvertFromStruct(&this->txins_,&data->txins);
  core::
  JsonObjectVector<cfd::js::api::json::BlindTxOutRequest,_cfd::js::api::BlindTxOutRequestStruct>::
  ConvertFromStruct(&this->txouts_,&data->txouts);
  __x = (data->txout_confidential_addresses).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (data->txout_confidential_addresses).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pbVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->txout_confidential_addresses_).
                   super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,__x);
      __x = __x + 1;
    } while (__x != pbVar1);
  }
  core::
  JsonObjectVector<cfd::js::api::json::BlindIssuanceRequest,_cfd::js::api::BlindIssuanceRequestStruct>
  ::ConvertFromStruct(&this->issuances_,&data->issuances);
  this->minimum_range_value_ = data->minimum_range_value;
  this->exponent_ = data->exponent;
  this->minimum_bits_ = data->minimum_bits;
  this->collect_blinder_ = data->collect_blinder;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void BlindRawTransactionRequest::ConvertFromStruct(
    const BlindRawTransactionRequestStruct& data) {
  tx_ = data.tx;
  txins_.ConvertFromStruct(data.txins);
  txouts_.ConvertFromStruct(data.txouts);
  txout_confidential_addresses_.ConvertFromStruct(
      data.txout_confidential_addresses);
  issuances_.ConvertFromStruct(data.issuances);
  minimum_range_value_ = data.minimum_range_value;
  exponent_ = data.exponent;
  minimum_bits_ = data.minimum_bits;
  collect_blinder_ = data.collect_blinder;
  ignore_items = data.ignore_items;
}